

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

PLYProperty * __thiscall gvr::PLYElement::findProperty(PLYElement *this,string *s)

{
  int iVar1;
  PLYProperty *pPVar2;
  pointer pPVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  pPVar3 = (this->list).
           super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->list).
      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
      ._M_impl.super__Vector_impl_data._M_finish == pPVar3) {
    return (PLYProperty *)0x0;
  }
  lVar5 = 0;
  uVar4 = 1;
  while( true ) {
    iVar1 = std::__cxx11::string::compare
                      ((string *)((long)&(pPVar3->name)._M_dataplus._M_p + lVar5));
    pPVar3 = (this->list).
             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar1 == 0) {
      pPVar2 = (PLYProperty *)((long)&pPVar3->enc + lVar5);
    }
    else {
      pPVar2 = (PLYProperty *)0x0;
    }
    if (pPVar2 != (PLYProperty *)0x0) break;
    lVar5 = lVar5 + 0x40;
    bVar6 = (ulong)((long)(this->list).
                          super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 6) <= uVar4;
    uVar4 = uVar4 + 1;
    if (bVar6) {
      return (PLYProperty *)0x0;
    }
  }
  return pPVar2;
}

Assistant:

PLYProperty *PLYElement::findProperty(const std::string &s)
{
  PLYProperty *ret=0;

  for (size_t i=0; i<list.size() && ret == 0; i++)
  {
    if (list[i].getName().compare(s) == 0)
    {
      ret=&list[i];
    }
  }

  return ret;
}